

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_macro5.c
# Opt level: O1

int dwarf_macro_operands_table
              (Dwarf_Macro_Context head,Dwarf_Half index,Dwarf_Half *opcode_number,
              Dwarf_Half *operand_count,Dwarf_Small **operand_array,Dwarf_Error *error)

{
  Dwarf_Macro_Forms_s *pDVar1;
  Dwarf_Debug dbg;
  
  if (head == (Dwarf_Macro_Context)0x0) {
    dbg = (Dwarf_Debug)0x0;
  }
  else {
    if (head->mc_sentinel == 0xada) {
      if (head->mc_opcode_count <= index) {
        _dwarf_error(head->mc_dbg,error,0x143);
        return 1;
      }
      pDVar1 = head->mc_opcode_forms;
      *opcode_number = (ushort)pDVar1[index].mf_code;
      *operand_count = (ushort)pDVar1[index].mf_formcount;
      *operand_array = pDVar1[index].mf_formbytes;
      return 0;
    }
    dbg = head->mc_dbg;
  }
  _dwarf_error_string(dbg,error,0x142,
                      "DW_DLE_BAD_MACRO_HEADER_POINTER  NULL header or corrupt header");
  return 1;
}

Assistant:

int
dwarf_macro_operands_table(Dwarf_Macro_Context head,
    Dwarf_Half  index, /* 0 to opcode_count -1 */
    Dwarf_Half  *opcode_number,
    Dwarf_Half  *operand_count,
    const Dwarf_Small **operand_array,
    Dwarf_Error *error)
{
    struct Dwarf_Macro_Forms_s * ops = 0;
    Dwarf_Debug dbg = 0;

    CHECKNULLCONTEXT(head,dbg,error);
    dbg = head->mc_dbg;
    if (index >= head->mc_opcode_count) {
        _dwarf_error(dbg, error, DW_DLE_BAD_MACRO_INDEX);
        return DW_DLV_ERROR;
    }
    ops = head->mc_opcode_forms + index;
    *opcode_number = ops->mf_code;
    *operand_count = ops->mf_formcount;
    *operand_array = ops->mf_formbytes;
    return DW_DLV_OK;
}